

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::ADC(CPU *this,uint8_t argument)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  undefined3 in_register_00000031;
  byte bVar4;
  
  bVar1 = this->A;
  uVar3 = (uint)((byte)this->field_0x2e >> 7) + (uint)bVar1 +
          CONCAT31(in_register_00000031,argument);
  bVar2 = (byte)uVar3;
  bVar4 = (bVar2 ^ bVar1) >> 6 & 2;
  if ((char)(bVar1 ^ argument) < '\0') {
    bVar4 = 0;
  }
  this->field_0x2e =
       bVar2 >> 7 | (bVar2 == 0) << 6 | this->field_0x2e & 0x3c | (0xff < uVar3) << 7 | bVar4;
  this->A = bVar2;
  return;
}

Assistant:

void CPU::ADC(uint8_t argument) {
	uint16_t sum = A + argument + C;
	C = (sum > 0xFF) ? 1 : 0;
	V = (!((A ^ argument) & (1 << 7)) && ((uint16_t(A) ^ sum) & (1 << 7))) ? 1 : 0;
	Z = ((sum & 0xFF) == 0) ? 1 : 0;
	N = (sum & (1 << 7)) ? 1 : 0;
	A = uint8_t(sum & 0xFF);
}